

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KaxBlock.cpp
# Opt level: O0

void __thiscall libmatroska::KaxBlockVirtual::KaxBlockVirtual(KaxBlockVirtual *this)

{
  KaxBlockVirtual *this_local;
  
  libebml::EbmlBinary::EbmlBinary(&this->super_EbmlBinary);
  (this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement =
       (_func_int **)&PTR__KaxBlockVirtual_00237540;
  this->ParentCluster = (KaxCluster *)0x0;
  libebml::EbmlBinary::SetBuffer(&this->super_EbmlBinary,this->DataBlock,5);
  libebml::EbmlElement::SetValueIsSet((EbmlElement *)this,false);
  return;
}

Assistant:

KaxBlockVirtual::KaxBlockVirtual(EBML_EXTRA_DEF)
  :EBML_DEF_BINARY(KaxBlockVirtual)EBML_DEF_SEP ParentCluster(NULL)
{
  SetBuffer(DataBlock,sizeof(DataBlock));
  SetValueIsSet(false);
}